

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeBatchResultToJUnit.cpp
# Opt level: O0

void parseCommandLine(CommandLine *cmdLine,int argc,char **argv)

{
  Error *this;
  allocator<char> local_41;
  string local_40;
  char **local_20;
  char **argv_local;
  CommandLine *pCStack_10;
  int argc_local;
  CommandLine *cmdLine_local;
  
  local_20 = argv;
  argv_local._4_4_ = argc;
  pCStack_10 = cmdLine;
  if (argc != 3) {
    this = (Error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Expected input and output paths",&local_41);
    xe::Error::Error(this,&local_40);
    __cxa_throw(this,&xe::Error::typeinfo,xe::Error::~Error);
  }
  std::__cxx11::string::operator=((string *)cmdLine,argv[1]);
  std::__cxx11::string::operator=((string *)&pCStack_10->outputFile,local_20[argv_local._4_4_ + -1])
  ;
  return;
}

Assistant:

static void parseCommandLine (CommandLine& cmdLine, int argc, const char* const* argv)
{
	if (argc != 3)
		throw xe::Error("Expected input and output paths");

	cmdLine.batchResultFile	= argv[argc-2];
	cmdLine.outputFile		= argv[argc-1];
}